

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O3

Matrix4f *
Matrix4f::lookAt(Matrix4f *__return_storage_ptr__,Vector3f *eye,Vector3f *center,Vector3f *up)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3f x;
  Vector3f y;
  Vector3f z;
  Vector4f local_64;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  operator-(eye,center);
  Vector3f::normalized((Vector3f *)&local_64);
  Vector3f::Vector3f(&local_48,up);
  Vector3f::cross(&local_48,&local_3c);
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  auVar4._0_4_ = Vector3f::dot(&local_54,eye);
  auVar4._4_60_ = extraout_var;
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar4._0_16_,auVar3);
  Vector4f::Vector4f(&local_64,&local_54,auVar3._0_4_);
  setRow(__return_storage_ptr__,0,&local_64);
  auVar5._0_4_ = Vector3f::dot(&local_48,eye);
  auVar5._4_60_ = extraout_var_00;
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar5._0_16_,auVar1);
  Vector4f::Vector4f(&local_64,&local_48,auVar3._0_4_);
  setRow(__return_storage_ptr__,1,&local_64);
  auVar6._0_4_ = Vector3f::dot(&local_3c,eye);
  auVar6._4_60_ = extraout_var_01;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3 = vxorps_avx512vl(auVar6._0_16_,auVar2);
  Vector4f::Vector4f(&local_64,&local_3c,auVar3._0_4_);
  setRow(__return_storage_ptr__,2,&local_64);
  Vector4f::Vector4f(&local_64,0.0,0.0,0.0,1.0);
  setRow(__return_storage_ptr__,3,&local_64);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::lookAt( const Vector3f& eye, const Vector3f& center, const Vector3f& up )
{
	// z is negative forward
	Vector3f z = ( eye - center ).normalized();
	Vector3f y = up;
	Vector3f x = Vector3f::cross( y, z );

	// the x, y, and z vectors define the orthonormal coordinate system
	// the affine part defines the overall translation
	Matrix4f view;

	view.setRow( 0, Vector4f( x, -Vector3f::dot( x, eye ) ) );
	view.setRow( 1, Vector4f( y, -Vector3f::dot( y, eye ) ) );
	view.setRow( 2, Vector4f( z, -Vector3f::dot( z, eye ) ) );
	view.setRow( 3, Vector4f( 0, 0, 0, 1 ) );

	return view;
}